

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

double HTS_lsp2en(HTS_Vocoder *v,double *lsp,size_t m,double alpha)

{
  double *c1;
  double *a;
  ulong uVar1;
  long lVar2;
  int m_00;
  double dVar3;
  
  a = v->spectrum2en_buff;
  if (v->spectrum2en_size < m) {
    if (a != (double *)0x0) {
      HTS_free(a);
    }
    a = (double *)HTS_calloc(m + 0x241,8);
    v->spectrum2en_buff = a;
    v->spectrum2en_size = m;
  }
  m_00 = (int)m;
  HTS_lsp2lpc(v,lsp + 1,a,m_00);
  dVar3 = *lsp;
  if (v->use_log_gain != '\0') {
    dVar3 = exp(dVar3);
  }
  c1 = v->spectrum2en_buff;
  *c1 = dVar3;
  HTS_ignorm(c1,c1,m_00,v->gamma);
  for (uVar1 = 1; uVar1 <= m; uVar1 = uVar1 + 1) {
    v->spectrum2en_buff[uVar1] =
         -(((double)CONCAT44(0x45300000,(int)(v->stage >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)v->stage) - 4503599627370496.0)) *
         v->spectrum2en_buff[uVar1];
  }
  HTS_mgc2mgc(v,v->spectrum2en_buff,m_00,alpha,v->gamma,a + m + 1,0x23f,0.0,1.0);
  dVar3 = 0.0;
  for (lVar2 = 1; lVar2 != 0x241; lVar2 = lVar2 + 1) {
    dVar3 = dVar3 + a[m + lVar2] * a[m + lVar2];
  }
  return dVar3;
}

Assistant:

static double HTS_lsp2en(HTS_Vocoder * v, double *lsp, size_t m, double alpha)
{
   size_t i;
   double en = 0.0;
   double *buff;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc(m + 1 + IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   buff = v->spectrum2en_buff + m + 1;

   /* lsp2lpc */
   HTS_lsp2lpc(v, lsp + 1, v->spectrum2en_buff, m);
   if (v->use_log_gain)
      v->spectrum2en_buff[0] = exp(lsp[0]);
   else
      v->spectrum2en_buff[0] = lsp[0];

   /* mgc2mgc */
   if (NORMFLG1)
      HTS_ignorm(v->spectrum2en_buff, v->spectrum2en_buff, m, v->gamma);
   else if (MULGFLG1)
      v->spectrum2en_buff[0] = (1.0 - v->spectrum2en_buff[0]) * ((double) v->stage);
   if (MULGFLG1)
      for (i = 1; i <= m; i++)
         v->spectrum2en_buff[i] *= -((double) v->stage);
   HTS_mgc2mgc(v, v->spectrum2en_buff, m, alpha, v->gamma, buff, IRLENG - 1, 0.0, 1);

   for (i = 0; i < IRLENG; i++)
      en += buff[i] * buff[i];
   return en;
}